

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::cni_holder<cs::numeric_(*)(const_tm_&),_cs::numeric_(*)(const_tm_&)>::cni_holder
          (cni_holder<cs::numeric_(*)(const_tm_&),_cs::numeric_(*)(const_tm_&)> *this,
          _func_numeric_tm_ptr **func)

{
  function<cs::numeric_(const_tm_&)> *in_RDI;
  cni_helper<cs::numeric_(*)(const_tm_&),_cs::numeric_(*)(const_tm_&)> *this_00;
  function<cs::numeric_(const_tm_&)> *in_stack_ffffffffffffffc0;
  _func_numeric_tm_ptr *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_003c2e80;
  this_00 = (cni_helper<cs::numeric_(*)(const_tm_&),_cs::numeric_(*)(const_tm_&)> *)
            ((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<cs::numeric(tm_const&)>::function<cs::numeric(*const&)(tm_const&),void>
            (in_stack_ffffffffffffffc0,local_30);
  cni_helper<cs::numeric_(*)(const_tm_&),_cs::numeric_(*)(const_tm_&)>::cni_helper(this_00,in_RDI);
  std::function<cs::numeric_(const_tm_&)>::~function((function<cs::numeric_(const_tm_&)> *)0x2bdb86)
  ;
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}